

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mml.c
# Opt level: O3

int mml_calc_duration(uint len)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = (uint)(0xc00000 / (ulong)len);
  if (snd_timebase == '\0') {
    uVar1 = uVar2 >> 8;
    uVar2 = uVar2 & 0xff;
    uVar3 = 0xff;
  }
  else {
    uVar2 = uVar2 * (0x100 - snd_tempo) * 0x1e0;
    uVar1 = uVar2 >> 0x18;
    uVar2 = uVar2 & 0xffffe0;
    uVar3 = 0xffffff;
  }
  snd_ticks_l = uVar2 + snd_ticks_l;
  if (uVar3 < snd_ticks_l) {
    snd_ticks_l = uVar3 & snd_ticks_l;
    return uVar1;
  }
  return (uVar1 - 1) + (uint)(uVar1 == 0);
}

Assistant:

int
mml_calc_duration(unsigned int len)
{
	unsigned int ticks, mask, tmp;

	/* ticks */
	ticks = 0xC00000 / len;

	/* base */
	if (snd_timebase == 0) {
		/* timer */
		mask = 0xFF;
		snd_ticks_h = (ticks >> 8);
		snd_ticks_l = (ticks & 0xFF) + snd_ticks_l;
	}
	else {
		/* fixed frequency (ie. vsync) */
		mask = 0xFFFFFF;
		tmp  = (256 - snd_tempo) * snd_timebase * ticks * 8;
		snd_ticks_h = (tmp >> 24);
		snd_ticks_l = (tmp & 0xFFFFFF) + snd_ticks_l;
	}

	/* adjust timings */
	if (snd_ticks_l  > mask) {
		snd_ticks_l &= mask;
		snd_ticks_h++;
	}
	if (snd_ticks_h == 0)
		snd_ticks_h = 1;

	/* result */
	return (snd_ticks_h - 1);
}